

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_txfm_utility_sse4.h
# Opt level: O2

void transpose_16x16(__m128i *in,__m128i *out)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  
  uVar1 = *(undefined4 *)((long)*in + 4);
  lVar9 = (*in)[1];
  uVar2 = *(undefined4 *)((long)*in + 0xc);
  lVar10 = in[4][0];
  uVar3 = *(undefined4 *)((long)in[4] + 4);
  lVar11 = in[4][1];
  uVar4 = *(undefined4 *)((long)in[4] + 0xc);
  lVar12 = in[8][0];
  uVar5 = *(undefined4 *)((long)in[8] + 4);
  lVar13 = in[8][1];
  uVar6 = *(undefined4 *)((long)in[8] + 0xc);
  lVar14 = in[0xc][0];
  uVar7 = *(undefined4 *)((long)in[0xc] + 4);
  lVar15 = in[0xc][1];
  uVar8 = *(undefined4 *)((long)in[0xc] + 0xc);
  *(int *)*out = (int)(*in)[0];
  *(int *)((long)*out + 4) = (int)lVar10;
  *(int *)(*out + 1) = (int)lVar12;
  *(int *)((long)*out + 0xc) = (int)lVar14;
  *(undefined4 *)out[4] = uVar1;
  *(undefined4 *)((long)out[4] + 4) = uVar3;
  *(undefined4 *)(out[4] + 1) = uVar5;
  *(undefined4 *)((long)out[4] + 0xc) = uVar7;
  *(int *)out[8] = (int)lVar9;
  *(int *)((long)out[8] + 4) = (int)lVar11;
  *(int *)(out[8] + 1) = (int)lVar13;
  *(int *)((long)out[8] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0xc] = uVar2;
  *(undefined4 *)((long)out[0xc] + 4) = uVar4;
  *(undefined4 *)(out[0xc] + 1) = uVar6;
  *(undefined4 *)((long)out[0xc] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[1] + 4);
  lVar9 = in[1][1];
  uVar2 = *(undefined4 *)((long)in[1] + 0xc);
  lVar10 = in[5][0];
  uVar3 = *(undefined4 *)((long)in[5] + 4);
  lVar11 = in[5][1];
  uVar4 = *(undefined4 *)((long)in[5] + 0xc);
  lVar12 = in[9][0];
  uVar5 = *(undefined4 *)((long)in[9] + 4);
  lVar13 = in[9][1];
  uVar6 = *(undefined4 *)((long)in[9] + 0xc);
  lVar14 = in[0xd][0];
  uVar7 = *(undefined4 *)((long)in[0xd] + 4);
  lVar15 = in[0xd][1];
  uVar8 = *(undefined4 *)((long)in[0xd] + 0xc);
  *(int *)out[0x10] = (int)in[1][0];
  *(int *)((long)out[0x10] + 4) = (int)lVar10;
  *(int *)(out[0x10] + 1) = (int)lVar12;
  *(int *)((long)out[0x10] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x14] = uVar1;
  *(undefined4 *)((long)out[0x14] + 4) = uVar3;
  *(undefined4 *)(out[0x14] + 1) = uVar5;
  *(undefined4 *)((long)out[0x14] + 0xc) = uVar7;
  *(int *)out[0x18] = (int)lVar9;
  *(int *)((long)out[0x18] + 4) = (int)lVar11;
  *(int *)(out[0x18] + 1) = (int)lVar13;
  *(int *)((long)out[0x18] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x1c] = uVar2;
  *(undefined4 *)((long)out[0x1c] + 4) = uVar4;
  *(undefined4 *)(out[0x1c] + 1) = uVar6;
  *(undefined4 *)((long)out[0x1c] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x10] + 4);
  lVar9 = in[0x10][1];
  uVar2 = *(undefined4 *)((long)in[0x10] + 0xc);
  lVar10 = in[0x14][0];
  uVar3 = *(undefined4 *)((long)in[0x14] + 4);
  lVar11 = in[0x14][1];
  uVar4 = *(undefined4 *)((long)in[0x14] + 0xc);
  lVar12 = in[0x18][0];
  uVar5 = *(undefined4 *)((long)in[0x18] + 4);
  lVar13 = in[0x18][1];
  uVar6 = *(undefined4 *)((long)in[0x18] + 0xc);
  lVar14 = in[0x1c][0];
  uVar7 = *(undefined4 *)((long)in[0x1c] + 4);
  lVar15 = in[0x1c][1];
  uVar8 = *(undefined4 *)((long)in[0x1c] + 0xc);
  *(int *)out[1] = (int)in[0x10][0];
  *(int *)((long)out[1] + 4) = (int)lVar10;
  *(int *)(out[1] + 1) = (int)lVar12;
  *(int *)((long)out[1] + 0xc) = (int)lVar14;
  *(undefined4 *)out[5] = uVar1;
  *(undefined4 *)((long)out[5] + 4) = uVar3;
  *(undefined4 *)(out[5] + 1) = uVar5;
  *(undefined4 *)((long)out[5] + 0xc) = uVar7;
  *(int *)out[9] = (int)lVar9;
  *(int *)((long)out[9] + 4) = (int)lVar11;
  *(int *)(out[9] + 1) = (int)lVar13;
  *(int *)((long)out[9] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0xd] = uVar2;
  *(undefined4 *)((long)out[0xd] + 4) = uVar4;
  *(undefined4 *)(out[0xd] + 1) = uVar6;
  *(undefined4 *)((long)out[0xd] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x11] + 4);
  lVar9 = in[0x11][1];
  uVar2 = *(undefined4 *)((long)in[0x11] + 0xc);
  lVar10 = in[0x15][0];
  uVar3 = *(undefined4 *)((long)in[0x15] + 4);
  lVar11 = in[0x15][1];
  uVar4 = *(undefined4 *)((long)in[0x15] + 0xc);
  lVar12 = in[0x19][0];
  uVar5 = *(undefined4 *)((long)in[0x19] + 4);
  lVar13 = in[0x19][1];
  uVar6 = *(undefined4 *)((long)in[0x19] + 0xc);
  lVar14 = in[0x1d][0];
  uVar7 = *(undefined4 *)((long)in[0x1d] + 4);
  lVar15 = in[0x1d][1];
  uVar8 = *(undefined4 *)((long)in[0x1d] + 0xc);
  *(int *)out[0x11] = (int)in[0x11][0];
  *(int *)((long)out[0x11] + 4) = (int)lVar10;
  *(int *)(out[0x11] + 1) = (int)lVar12;
  *(int *)((long)out[0x11] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x15] = uVar1;
  *(undefined4 *)((long)out[0x15] + 4) = uVar3;
  *(undefined4 *)(out[0x15] + 1) = uVar5;
  *(undefined4 *)((long)out[0x15] + 0xc) = uVar7;
  *(int *)out[0x19] = (int)lVar9;
  *(int *)((long)out[0x19] + 4) = (int)lVar11;
  *(int *)(out[0x19] + 1) = (int)lVar13;
  *(int *)((long)out[0x19] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x1d] = uVar2;
  *(undefined4 *)((long)out[0x1d] + 4) = uVar4;
  *(undefined4 *)(out[0x1d] + 1) = uVar6;
  *(undefined4 *)((long)out[0x1d] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[2] + 4);
  lVar9 = in[2][1];
  uVar2 = *(undefined4 *)((long)in[2] + 0xc);
  lVar10 = in[6][0];
  uVar3 = *(undefined4 *)((long)in[6] + 4);
  lVar11 = in[6][1];
  uVar4 = *(undefined4 *)((long)in[6] + 0xc);
  lVar12 = in[10][0];
  uVar5 = *(undefined4 *)((long)in[10] + 4);
  lVar13 = in[10][1];
  uVar6 = *(undefined4 *)((long)in[10] + 0xc);
  lVar14 = in[0xe][0];
  uVar7 = *(undefined4 *)((long)in[0xe] + 4);
  lVar15 = in[0xe][1];
  uVar8 = *(undefined4 *)((long)in[0xe] + 0xc);
  *(int *)out[0x20] = (int)in[2][0];
  *(int *)((long)out[0x20] + 4) = (int)lVar10;
  *(int *)(out[0x20] + 1) = (int)lVar12;
  *(int *)((long)out[0x20] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x24] = uVar1;
  *(undefined4 *)((long)out[0x24] + 4) = uVar3;
  *(undefined4 *)(out[0x24] + 1) = uVar5;
  *(undefined4 *)((long)out[0x24] + 0xc) = uVar7;
  *(int *)out[0x28] = (int)lVar9;
  *(int *)((long)out[0x28] + 4) = (int)lVar11;
  *(int *)(out[0x28] + 1) = (int)lVar13;
  *(int *)((long)out[0x28] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x2c] = uVar2;
  *(undefined4 *)((long)out[0x2c] + 4) = uVar4;
  *(undefined4 *)(out[0x2c] + 1) = uVar6;
  *(undefined4 *)((long)out[0x2c] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[3] + 4);
  lVar9 = in[3][1];
  uVar2 = *(undefined4 *)((long)in[3] + 0xc);
  lVar10 = in[7][0];
  uVar3 = *(undefined4 *)((long)in[7] + 4);
  lVar11 = in[7][1];
  uVar4 = *(undefined4 *)((long)in[7] + 0xc);
  lVar12 = in[0xb][0];
  uVar5 = *(undefined4 *)((long)in[0xb] + 4);
  lVar13 = in[0xb][1];
  uVar6 = *(undefined4 *)((long)in[0xb] + 0xc);
  lVar14 = in[0xf][0];
  uVar7 = *(undefined4 *)((long)in[0xf] + 4);
  lVar15 = in[0xf][1];
  uVar8 = *(undefined4 *)((long)in[0xf] + 0xc);
  *(int *)out[0x30] = (int)in[3][0];
  *(int *)((long)out[0x30] + 4) = (int)lVar10;
  *(int *)(out[0x30] + 1) = (int)lVar12;
  *(int *)((long)out[0x30] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x34] = uVar1;
  *(undefined4 *)((long)out[0x34] + 4) = uVar3;
  *(undefined4 *)(out[0x34] + 1) = uVar5;
  *(undefined4 *)((long)out[0x34] + 0xc) = uVar7;
  *(int *)out[0x38] = (int)lVar9;
  *(int *)((long)out[0x38] + 4) = (int)lVar11;
  *(int *)(out[0x38] + 1) = (int)lVar13;
  *(int *)((long)out[0x38] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x3c] = uVar2;
  *(undefined4 *)((long)out[0x3c] + 4) = uVar4;
  *(undefined4 *)(out[0x3c] + 1) = uVar6;
  *(undefined4 *)((long)out[0x3c] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x12] + 4);
  lVar9 = in[0x12][1];
  uVar2 = *(undefined4 *)((long)in[0x12] + 0xc);
  lVar10 = in[0x16][0];
  uVar3 = *(undefined4 *)((long)in[0x16] + 4);
  lVar11 = in[0x16][1];
  uVar4 = *(undefined4 *)((long)in[0x16] + 0xc);
  lVar12 = in[0x1a][0];
  uVar5 = *(undefined4 *)((long)in[0x1a] + 4);
  lVar13 = in[0x1a][1];
  uVar6 = *(undefined4 *)((long)in[0x1a] + 0xc);
  lVar14 = in[0x1e][0];
  uVar7 = *(undefined4 *)((long)in[0x1e] + 4);
  lVar15 = in[0x1e][1];
  uVar8 = *(undefined4 *)((long)in[0x1e] + 0xc);
  *(int *)out[0x21] = (int)in[0x12][0];
  *(int *)((long)out[0x21] + 4) = (int)lVar10;
  *(int *)(out[0x21] + 1) = (int)lVar12;
  *(int *)((long)out[0x21] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x25] = uVar1;
  *(undefined4 *)((long)out[0x25] + 4) = uVar3;
  *(undefined4 *)(out[0x25] + 1) = uVar5;
  *(undefined4 *)((long)out[0x25] + 0xc) = uVar7;
  *(int *)out[0x29] = (int)lVar9;
  *(int *)((long)out[0x29] + 4) = (int)lVar11;
  *(int *)(out[0x29] + 1) = (int)lVar13;
  *(int *)((long)out[0x29] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x2d] = uVar2;
  *(undefined4 *)((long)out[0x2d] + 4) = uVar4;
  *(undefined4 *)(out[0x2d] + 1) = uVar6;
  *(undefined4 *)((long)out[0x2d] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x13] + 4);
  lVar9 = in[0x13][1];
  uVar2 = *(undefined4 *)((long)in[0x13] + 0xc);
  lVar10 = in[0x17][0];
  uVar3 = *(undefined4 *)((long)in[0x17] + 4);
  lVar11 = in[0x17][1];
  uVar4 = *(undefined4 *)((long)in[0x17] + 0xc);
  lVar12 = in[0x1b][0];
  uVar5 = *(undefined4 *)((long)in[0x1b] + 4);
  lVar13 = in[0x1b][1];
  uVar6 = *(undefined4 *)((long)in[0x1b] + 0xc);
  lVar14 = in[0x1f][0];
  uVar7 = *(undefined4 *)((long)in[0x1f] + 4);
  lVar15 = in[0x1f][1];
  uVar8 = *(undefined4 *)((long)in[0x1f] + 0xc);
  *(int *)out[0x31] = (int)in[0x13][0];
  *(int *)((long)out[0x31] + 4) = (int)lVar10;
  *(int *)(out[0x31] + 1) = (int)lVar12;
  *(int *)((long)out[0x31] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x35] = uVar1;
  *(undefined4 *)((long)out[0x35] + 4) = uVar3;
  *(undefined4 *)(out[0x35] + 1) = uVar5;
  *(undefined4 *)((long)out[0x35] + 0xc) = uVar7;
  *(int *)out[0x39] = (int)lVar9;
  *(int *)((long)out[0x39] + 4) = (int)lVar11;
  *(int *)(out[0x39] + 1) = (int)lVar13;
  *(int *)((long)out[0x39] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x3d] = uVar2;
  *(undefined4 *)((long)out[0x3d] + 4) = uVar4;
  *(undefined4 *)(out[0x3d] + 1) = uVar6;
  *(undefined4 *)((long)out[0x3d] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x20] + 4);
  lVar9 = in[0x20][1];
  uVar2 = *(undefined4 *)((long)in[0x20] + 0xc);
  lVar10 = in[0x24][0];
  uVar3 = *(undefined4 *)((long)in[0x24] + 4);
  lVar11 = in[0x24][1];
  uVar4 = *(undefined4 *)((long)in[0x24] + 0xc);
  lVar12 = in[0x28][0];
  uVar5 = *(undefined4 *)((long)in[0x28] + 4);
  lVar13 = in[0x28][1];
  uVar6 = *(undefined4 *)((long)in[0x28] + 0xc);
  lVar14 = in[0x2c][0];
  uVar7 = *(undefined4 *)((long)in[0x2c] + 4);
  lVar15 = in[0x2c][1];
  uVar8 = *(undefined4 *)((long)in[0x2c] + 0xc);
  *(int *)out[2] = (int)in[0x20][0];
  *(int *)((long)out[2] + 4) = (int)lVar10;
  *(int *)(out[2] + 1) = (int)lVar12;
  *(int *)((long)out[2] + 0xc) = (int)lVar14;
  *(undefined4 *)out[6] = uVar1;
  *(undefined4 *)((long)out[6] + 4) = uVar3;
  *(undefined4 *)(out[6] + 1) = uVar5;
  *(undefined4 *)((long)out[6] + 0xc) = uVar7;
  *(int *)out[10] = (int)lVar9;
  *(int *)((long)out[10] + 4) = (int)lVar11;
  *(int *)(out[10] + 1) = (int)lVar13;
  *(int *)((long)out[10] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0xe] = uVar2;
  *(undefined4 *)((long)out[0xe] + 4) = uVar4;
  *(undefined4 *)(out[0xe] + 1) = uVar6;
  *(undefined4 *)((long)out[0xe] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x21] + 4);
  lVar9 = in[0x21][1];
  uVar2 = *(undefined4 *)((long)in[0x21] + 0xc);
  lVar10 = in[0x25][0];
  uVar3 = *(undefined4 *)((long)in[0x25] + 4);
  lVar11 = in[0x25][1];
  uVar4 = *(undefined4 *)((long)in[0x25] + 0xc);
  lVar12 = in[0x29][0];
  uVar5 = *(undefined4 *)((long)in[0x29] + 4);
  lVar13 = in[0x29][1];
  uVar6 = *(undefined4 *)((long)in[0x29] + 0xc);
  lVar14 = in[0x2d][0];
  uVar7 = *(undefined4 *)((long)in[0x2d] + 4);
  lVar15 = in[0x2d][1];
  uVar8 = *(undefined4 *)((long)in[0x2d] + 0xc);
  *(int *)out[0x12] = (int)in[0x21][0];
  *(int *)((long)out[0x12] + 4) = (int)lVar10;
  *(int *)(out[0x12] + 1) = (int)lVar12;
  *(int *)((long)out[0x12] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x16] = uVar1;
  *(undefined4 *)((long)out[0x16] + 4) = uVar3;
  *(undefined4 *)(out[0x16] + 1) = uVar5;
  *(undefined4 *)((long)out[0x16] + 0xc) = uVar7;
  *(int *)out[0x1a] = (int)lVar9;
  *(int *)((long)out[0x1a] + 4) = (int)lVar11;
  *(int *)(out[0x1a] + 1) = (int)lVar13;
  *(int *)((long)out[0x1a] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x1e] = uVar2;
  *(undefined4 *)((long)out[0x1e] + 4) = uVar4;
  *(undefined4 *)(out[0x1e] + 1) = uVar6;
  *(undefined4 *)((long)out[0x1e] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x30] + 4);
  lVar9 = in[0x30][1];
  uVar2 = *(undefined4 *)((long)in[0x30] + 0xc);
  lVar10 = in[0x34][0];
  uVar3 = *(undefined4 *)((long)in[0x34] + 4);
  lVar11 = in[0x34][1];
  uVar4 = *(undefined4 *)((long)in[0x34] + 0xc);
  lVar12 = in[0x38][0];
  uVar5 = *(undefined4 *)((long)in[0x38] + 4);
  lVar13 = in[0x38][1];
  uVar6 = *(undefined4 *)((long)in[0x38] + 0xc);
  lVar14 = in[0x3c][0];
  uVar7 = *(undefined4 *)((long)in[0x3c] + 4);
  lVar15 = in[0x3c][1];
  uVar8 = *(undefined4 *)((long)in[0x3c] + 0xc);
  *(int *)out[3] = (int)in[0x30][0];
  *(int *)((long)out[3] + 4) = (int)lVar10;
  *(int *)(out[3] + 1) = (int)lVar12;
  *(int *)((long)out[3] + 0xc) = (int)lVar14;
  *(undefined4 *)out[7] = uVar1;
  *(undefined4 *)((long)out[7] + 4) = uVar3;
  *(undefined4 *)(out[7] + 1) = uVar5;
  *(undefined4 *)((long)out[7] + 0xc) = uVar7;
  *(int *)out[0xb] = (int)lVar9;
  *(int *)((long)out[0xb] + 4) = (int)lVar11;
  *(int *)(out[0xb] + 1) = (int)lVar13;
  *(int *)((long)out[0xb] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0xf] = uVar2;
  *(undefined4 *)((long)out[0xf] + 4) = uVar4;
  *(undefined4 *)(out[0xf] + 1) = uVar6;
  *(undefined4 *)((long)out[0xf] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x31] + 4);
  lVar9 = in[0x31][1];
  uVar2 = *(undefined4 *)((long)in[0x31] + 0xc);
  lVar10 = in[0x35][0];
  uVar3 = *(undefined4 *)((long)in[0x35] + 4);
  lVar11 = in[0x35][1];
  uVar4 = *(undefined4 *)((long)in[0x35] + 0xc);
  lVar12 = in[0x39][0];
  uVar5 = *(undefined4 *)((long)in[0x39] + 4);
  lVar13 = in[0x39][1];
  uVar6 = *(undefined4 *)((long)in[0x39] + 0xc);
  lVar14 = in[0x3d][0];
  uVar7 = *(undefined4 *)((long)in[0x3d] + 4);
  lVar15 = in[0x3d][1];
  uVar8 = *(undefined4 *)((long)in[0x3d] + 0xc);
  *(int *)out[0x13] = (int)in[0x31][0];
  *(int *)((long)out[0x13] + 4) = (int)lVar10;
  *(int *)(out[0x13] + 1) = (int)lVar12;
  *(int *)((long)out[0x13] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x17] = uVar1;
  *(undefined4 *)((long)out[0x17] + 4) = uVar3;
  *(undefined4 *)(out[0x17] + 1) = uVar5;
  *(undefined4 *)((long)out[0x17] + 0xc) = uVar7;
  *(int *)out[0x1b] = (int)lVar9;
  *(int *)((long)out[0x1b] + 4) = (int)lVar11;
  *(int *)(out[0x1b] + 1) = (int)lVar13;
  *(int *)((long)out[0x1b] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x1f] = uVar2;
  *(undefined4 *)((long)out[0x1f] + 4) = uVar4;
  *(undefined4 *)(out[0x1f] + 1) = uVar6;
  *(undefined4 *)((long)out[0x1f] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x22] + 4);
  lVar9 = in[0x22][1];
  uVar2 = *(undefined4 *)((long)in[0x22] + 0xc);
  lVar10 = in[0x26][0];
  uVar3 = *(undefined4 *)((long)in[0x26] + 4);
  lVar11 = in[0x26][1];
  uVar4 = *(undefined4 *)((long)in[0x26] + 0xc);
  lVar12 = in[0x2a][0];
  uVar5 = *(undefined4 *)((long)in[0x2a] + 4);
  lVar13 = in[0x2a][1];
  uVar6 = *(undefined4 *)((long)in[0x2a] + 0xc);
  lVar14 = in[0x2e][0];
  uVar7 = *(undefined4 *)((long)in[0x2e] + 4);
  lVar15 = in[0x2e][1];
  uVar8 = *(undefined4 *)((long)in[0x2e] + 0xc);
  *(int *)out[0x22] = (int)in[0x22][0];
  *(int *)((long)out[0x22] + 4) = (int)lVar10;
  *(int *)(out[0x22] + 1) = (int)lVar12;
  *(int *)((long)out[0x22] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x26] = uVar1;
  *(undefined4 *)((long)out[0x26] + 4) = uVar3;
  *(undefined4 *)(out[0x26] + 1) = uVar5;
  *(undefined4 *)((long)out[0x26] + 0xc) = uVar7;
  *(int *)out[0x2a] = (int)lVar9;
  *(int *)((long)out[0x2a] + 4) = (int)lVar11;
  *(int *)(out[0x2a] + 1) = (int)lVar13;
  *(int *)((long)out[0x2a] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x2e] = uVar2;
  *(undefined4 *)((long)out[0x2e] + 4) = uVar4;
  *(undefined4 *)(out[0x2e] + 1) = uVar6;
  *(undefined4 *)((long)out[0x2e] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x23] + 4);
  lVar9 = in[0x23][1];
  uVar2 = *(undefined4 *)((long)in[0x23] + 0xc);
  lVar10 = in[0x27][0];
  uVar3 = *(undefined4 *)((long)in[0x27] + 4);
  lVar11 = in[0x27][1];
  uVar4 = *(undefined4 *)((long)in[0x27] + 0xc);
  lVar12 = in[0x2b][0];
  uVar5 = *(undefined4 *)((long)in[0x2b] + 4);
  lVar13 = in[0x2b][1];
  uVar6 = *(undefined4 *)((long)in[0x2b] + 0xc);
  lVar14 = in[0x2f][0];
  uVar7 = *(undefined4 *)((long)in[0x2f] + 4);
  lVar15 = in[0x2f][1];
  uVar8 = *(undefined4 *)((long)in[0x2f] + 0xc);
  *(int *)out[0x32] = (int)in[0x23][0];
  *(int *)((long)out[0x32] + 4) = (int)lVar10;
  *(int *)(out[0x32] + 1) = (int)lVar12;
  *(int *)((long)out[0x32] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x36] = uVar1;
  *(undefined4 *)((long)out[0x36] + 4) = uVar3;
  *(undefined4 *)(out[0x36] + 1) = uVar5;
  *(undefined4 *)((long)out[0x36] + 0xc) = uVar7;
  *(int *)out[0x3a] = (int)lVar9;
  *(int *)((long)out[0x3a] + 4) = (int)lVar11;
  *(int *)(out[0x3a] + 1) = (int)lVar13;
  *(int *)((long)out[0x3a] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x3e] = uVar2;
  *(undefined4 *)((long)out[0x3e] + 4) = uVar4;
  *(undefined4 *)(out[0x3e] + 1) = uVar6;
  *(undefined4 *)((long)out[0x3e] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x32] + 4);
  lVar9 = in[0x32][1];
  uVar2 = *(undefined4 *)((long)in[0x32] + 0xc);
  lVar10 = in[0x36][0];
  uVar3 = *(undefined4 *)((long)in[0x36] + 4);
  lVar11 = in[0x36][1];
  uVar4 = *(undefined4 *)((long)in[0x36] + 0xc);
  lVar12 = in[0x3a][0];
  uVar5 = *(undefined4 *)((long)in[0x3a] + 4);
  lVar13 = in[0x3a][1];
  uVar6 = *(undefined4 *)((long)in[0x3a] + 0xc);
  lVar14 = in[0x3e][0];
  uVar7 = *(undefined4 *)((long)in[0x3e] + 4);
  lVar15 = in[0x3e][1];
  uVar8 = *(undefined4 *)((long)in[0x3e] + 0xc);
  *(int *)out[0x23] = (int)in[0x32][0];
  *(int *)((long)out[0x23] + 4) = (int)lVar10;
  *(int *)(out[0x23] + 1) = (int)lVar12;
  *(int *)((long)out[0x23] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x27] = uVar1;
  *(undefined4 *)((long)out[0x27] + 4) = uVar3;
  *(undefined4 *)(out[0x27] + 1) = uVar5;
  *(undefined4 *)((long)out[0x27] + 0xc) = uVar7;
  *(int *)out[0x2b] = (int)lVar9;
  *(int *)((long)out[0x2b] + 4) = (int)lVar11;
  *(int *)(out[0x2b] + 1) = (int)lVar13;
  *(int *)((long)out[0x2b] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x2f] = uVar2;
  *(undefined4 *)((long)out[0x2f] + 4) = uVar4;
  *(undefined4 *)(out[0x2f] + 1) = uVar6;
  *(undefined4 *)((long)out[0x2f] + 0xc) = uVar8;
  uVar1 = *(undefined4 *)((long)in[0x33] + 4);
  lVar9 = in[0x33][1];
  uVar2 = *(undefined4 *)((long)in[0x33] + 0xc);
  lVar10 = in[0x37][0];
  uVar3 = *(undefined4 *)((long)in[0x37] + 4);
  lVar11 = in[0x37][1];
  uVar4 = *(undefined4 *)((long)in[0x37] + 0xc);
  lVar12 = in[0x3b][0];
  uVar5 = *(undefined4 *)((long)in[0x3b] + 4);
  lVar13 = in[0x3b][1];
  uVar6 = *(undefined4 *)((long)in[0x3b] + 0xc);
  lVar14 = in[0x3f][0];
  uVar7 = *(undefined4 *)((long)in[0x3f] + 4);
  lVar15 = in[0x3f][1];
  uVar8 = *(undefined4 *)((long)in[0x3f] + 0xc);
  *(int *)out[0x33] = (int)in[0x33][0];
  *(int *)((long)out[0x33] + 4) = (int)lVar10;
  *(int *)(out[0x33] + 1) = (int)lVar12;
  *(int *)((long)out[0x33] + 0xc) = (int)lVar14;
  *(undefined4 *)out[0x37] = uVar1;
  *(undefined4 *)((long)out[0x37] + 4) = uVar3;
  *(undefined4 *)(out[0x37] + 1) = uVar5;
  *(undefined4 *)((long)out[0x37] + 0xc) = uVar7;
  *(int *)out[0x3b] = (int)lVar9;
  *(int *)((long)out[0x3b] + 4) = (int)lVar11;
  *(int *)(out[0x3b] + 1) = (int)lVar13;
  *(int *)((long)out[0x3b] + 0xc) = (int)lVar15;
  *(undefined4 *)out[0x3f] = uVar2;
  *(undefined4 *)((long)out[0x3f] + 4) = uVar4;
  *(undefined4 *)(out[0x3f] + 1) = uVar6;
  *(undefined4 *)((long)out[0x3f] + 0xc) = uVar8;
  return;
}

Assistant:

static inline void transpose_16x16(const __m128i *in, __m128i *out) {
  // Upper left 8x8
  TRANSPOSE_4X4(in[0], in[4], in[8], in[12], out[0], out[4], out[8], out[12]);
  TRANSPOSE_4X4(in[1], in[5], in[9], in[13], out[16], out[20], out[24],
                out[28]);
  TRANSPOSE_4X4(in[16], in[20], in[24], in[28], out[1], out[5], out[9],
                out[13]);
  TRANSPOSE_4X4(in[17], in[21], in[25], in[29], out[17], out[21], out[25],
                out[29]);

  // Upper right 8x8
  TRANSPOSE_4X4(in[2], in[6], in[10], in[14], out[32], out[36], out[40],
                out[44]);
  TRANSPOSE_4X4(in[3], in[7], in[11], in[15], out[48], out[52], out[56],
                out[60]);
  TRANSPOSE_4X4(in[18], in[22], in[26], in[30], out[33], out[37], out[41],
                out[45]);
  TRANSPOSE_4X4(in[19], in[23], in[27], in[31], out[49], out[53], out[57],
                out[61]);

  // Lower left 8x8
  TRANSPOSE_4X4(in[32], in[36], in[40], in[44], out[2], out[6], out[10],
                out[14]);
  TRANSPOSE_4X4(in[33], in[37], in[41], in[45], out[18], out[22], out[26],
                out[30]);
  TRANSPOSE_4X4(in[48], in[52], in[56], in[60], out[3], out[7], out[11],
                out[15]);
  TRANSPOSE_4X4(in[49], in[53], in[57], in[61], out[19], out[23], out[27],
                out[31]);
  // Lower right 8x8
  TRANSPOSE_4X4(in[34], in[38], in[42], in[46], out[34], out[38], out[42],
                out[46]);
  TRANSPOSE_4X4(in[35], in[39], in[43], in[47], out[50], out[54], out[58],
                out[62]);
  TRANSPOSE_4X4(in[50], in[54], in[58], in[62], out[35], out[39], out[43],
                out[47]);
  TRANSPOSE_4X4(in[51], in[55], in[59], in[63], out[51], out[55], out[59],
                out[63]);
}